

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClau.c
# Opt level: O0

int * Fra_ClauCreateMapping(Vec_Int_t *vSatVarsFrom,Vec_Int_t *vSatVarsTo,int nVarsMax)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  int local_30;
  int i;
  int Var;
  int *pMapping;
  int nVarsMax_local;
  Vec_Int_t *vSatVarsTo_local;
  Vec_Int_t *vSatVarsFrom_local;
  
  iVar1 = Vec_IntSize(vSatVarsFrom);
  iVar2 = Vec_IntSize(vSatVarsTo);
  if (iVar1 != iVar2) {
    __assert_fail("Vec_IntSize(vSatVarsFrom) == Vec_IntSize(vSatVarsTo)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/fra/fraClau.c"
                  ,0x9d,"int *Fra_ClauCreateMapping(Vec_Int_t *, Vec_Int_t *, int)");
  }
  piVar3 = (int *)malloc((long)nVarsMax << 2);
  for (local_30 = 0; local_30 < nVarsMax; local_30 = local_30 + 1) {
    piVar3[local_30] = -1;
  }
  for (local_30 = 0; iVar1 = Vec_IntSize(vSatVarsFrom), local_30 < iVar1; local_30 = local_30 + 1) {
    iVar1 = Vec_IntEntry(vSatVarsFrom,local_30);
    iVar2 = Vec_IntEntry(vSatVarsTo,local_30);
    piVar3[iVar1] = iVar2;
  }
  return piVar3;
}

Assistant:

int * Fra_ClauCreateMapping( Vec_Int_t * vSatVarsFrom, Vec_Int_t * vSatVarsTo, int nVarsMax )
{
    int * pMapping, Var, i;
    assert( Vec_IntSize(vSatVarsFrom) == Vec_IntSize(vSatVarsTo) );
    pMapping = ABC_ALLOC( int, nVarsMax );
    for ( i = 0; i < nVarsMax; i++ )
        pMapping[i] = -1;
    Vec_IntForEachEntry( vSatVarsFrom, Var, i )
        pMapping[Var] = Vec_IntEntry(vSatVarsTo,i);
    return pMapping;
}